

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Abc_Obj_t * Io_ReadCreateNode(Abc_Ntk_t *pNtk,char *pNameOut,char **pNamesIn,int nInputs)

{
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar1;
  ulong uVar2;
  ulong uVar3;
  
  pFanin = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nInputs;
  if (nInputs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNamesIn[uVar2]);
    Abc_ObjAddFanin(pFanin,pAVar1);
  }
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pNameOut);
  Abc_ObjAddFanin(pAVar1,pFanin);
  return pFanin;
}

Assistant:

Abc_Obj_t * Io_ReadCreateNode( Abc_Ntk_t * pNtk, char * pNameOut, char * pNamesIn[], int nInputs )
{
    Abc_Obj_t * pNet, * pNode;
    int i;
    // create a new node 
    pNode = Abc_NtkCreateNode( pNtk );
    // add the fanin nets
    for ( i = 0; i < nInputs; i++ )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtk, pNamesIn[i] );
        Abc_ObjAddFanin( pNode, pNet );
    }
    // add the fanout net
    pNet = Abc_NtkFindOrCreateNet( pNtk, pNameOut );
    Abc_ObjAddFanin( pNet, pNode );
    return pNode;
}